

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

bool __thiscall mkvmuxer::Cues::Write(Cues *this,IMkvWriter *writer)

{
  CuePoint *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  uint64_t value;
  uint64 uVar4;
  int extraout_var;
  int extraout_var_00;
  long lVar5;
  uint64 size;
  
  if (writer == (IMkvWriter *)0x0) {
    return false;
  }
  if (this->cue_entries_size_ < 1) {
    size = 0;
  }
  else {
    lVar5 = 0;
    size = 0;
    do {
      if (this->cue_entries_ == (CuePoint **)0x0) {
        return false;
      }
      this_00 = this->cue_entries_[lVar5];
      if (this_00 == (CuePoint *)0x0) {
        return false;
      }
      value = CuePoint::PayloadSize(this_00);
      uVar4 = EbmlMasterElementSize(0xbb,value);
      size = size + value + uVar4;
      lVar5 = lVar5 + 1;
    } while (lVar5 < this->cue_entries_size_);
  }
  bVar1 = WriteEbmlMasterElement(writer,0x1c53bb6b,size);
  if (bVar1) {
    iVar2 = (*writer->_vptr_IMkvWriter[1])(writer);
    if (-1 < extraout_var) {
      if (0 < this->cue_entries_size_) {
        lVar5 = 0;
        do {
          bVar1 = CuePoint::Write(this->cue_entries_[lVar5],writer);
          if (!bVar1) {
            return false;
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < this->cue_entries_size_);
      }
      iVar3 = (*writer->_vptr_IMkvWriter[1])(writer);
      if (-1 < extraout_var_00) {
        return CONCAT44(extraout_var_00,iVar3) - CONCAT44(extraout_var,iVar2) == size;
      }
    }
  }
  return false;
}

Assistant:

bool Cues::Write(IMkvWriter* writer) const {
  if (!writer)
    return false;

  uint64_t size = 0;
  for (int32_t i = 0; i < cue_entries_size_; ++i) {
    const CuePoint* const cue = GetCueByIndex(i);

    if (!cue)
      return false;

    size += cue->Size();
  }

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvCues, size))
    return false;

  const int64_t payload_position = writer->Position();
  if (payload_position < 0)
    return false;

  for (int32_t i = 0; i < cue_entries_size_; ++i) {
    const CuePoint* const cue = GetCueByIndex(i);

    if (!cue->Write(writer))
      return false;
  }

  const int64_t stop_position = writer->Position();
  if (stop_position < 0)
    return false;

  if (stop_position - payload_position != static_cast<int64_t>(size))
    return false;

  return true;
}